

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<TestType,_true,_std::allocator<unsigned_long>_>::indexToOffset
          (View<TestType,_true,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  bool bVar1;
  size_t sVar2;
  CoordinateOrder *pCVar3;
  size_t sVar4;
  size_t local_30;
  size_t j_1;
  size_t j;
  size_t *out_local;
  size_t index_local;
  View<TestType,_true,_std::allocator<unsigned_long>_> *this_local;
  
  testInvariant(this);
  sVar2 = size(this);
  marray_detail::Assert<bool>(index < sVar2);
  bVar1 = isSimple(this);
  if (bVar1) {
    *out = index;
  }
  else {
    *out = 0;
    pCVar3 = coordinateOrder(this);
    out_local = (size_t *)index;
    if (*pCVar3 == FirstMajorOrder) {
      for (j_1 = 0; sVar2 = dimension(this), j_1 < sVar2; j_1 = j_1 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                          (&this->geometry_,j_1);
        sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (&this->geometry_,j_1);
        *out = sVar2 * ((ulong)out_local / sVar4) + *out;
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (&this->geometry_,j_1);
        out_local = (size_t *)((ulong)out_local % sVar2);
      }
    }
    else {
      sVar2 = dimension(this);
      if (sVar2 == 0) {
        marray_detail::Assert<bool>(index == 0);
      }
      else {
        local_30 = dimension(this);
        do {
          local_30 = local_30 - 1;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                            (&this->geometry_,local_30);
          sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            (&this->geometry_,local_30);
          *out = sVar2 * ((ulong)out_local / sVar4) + *out;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            (&this->geometry_,local_30);
          out_local = (size_t *)((ulong)out_local % sVar2);
        } while (local_30 != 0);
      }
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}